

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void finish_example(vw *all,audit_regressor_data *dd,example *ec)

{
  bool bVar1;
  long lVar2;
  size_t in_RDX;
  size_t in_RSI;
  long *in_RDI;
  undefined1 auVar3 [16];
  vw *unaff_retaddr;
  bool printed;
  float in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  vw *in_stack_ffffffffffffffd0;
  float local_20;
  
  bVar1 = false;
  local_20 = (float)(*(long *)(in_RDX + 0x6898) + 1);
  if ((*(float *)(*in_RDI + 0x50) <= local_20) && ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0)) {
    in_stack_ffffffffffffffd0 = *(vw **)(in_RSI + 0x38);
    print_ex(unaff_retaddr,(size_t)in_RDI,in_RSI,in_RDX);
    lVar2 = *(long *)(in_RDX + 0x6898) + 1;
    auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar3._0_8_ = lVar2;
    auVar3._12_4_ = 0x45300000;
    *(double *)(*in_RDI + 0x30) =
         (auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
    shared_data::update_dump_interval
              ((shared_data *)in_stack_ffffffffffffffd0,
               SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0),in_stack_ffffffffffffffc8);
    bVar1 = true;
  }
  if (*(long *)(in_RSI + 0x38) == *(long *)(in_RSI + 0x30)) {
    if (!bVar1) {
      print_ex(unaff_retaddr,(size_t)in_RDI,in_RSI,in_RDX);
    }
    set_done((vw *)0x340565);
  }
  VW::finish_example(in_stack_ffffffffffffffd0,
                     (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void finish_example(vw& all, audit_regressor_data& dd, example& ec)
{
  bool printed = false;
  if (ec.example_counter + 1 >= all.sd->dump_interval && !all.quiet)
  {
    print_ex(all, ec.example_counter + 1, dd.values_audited, dd.values_audited * 100 / dd.loaded_regressor_values);
    all.sd->weighted_unlabeled_examples = (double)(ec.example_counter + 1);  // used in update_dump_interval
    all.sd->update_dump_interval(all.progress_add, all.progress_arg);
    printed = true;
  }

  if (dd.values_audited == dd.loaded_regressor_values)
  {
    // all regressor values were audited
    if (!printed)
      print_ex(all, ec.example_counter + 1, dd.values_audited, 100);
    set_done(all);
  }

  VW::finish_example(all, ec);
}